

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetItem
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,uint32 index,
          Var value,PropertyOperationFlags flags)

{
  bool bVar1;
  BOOL BVar2;
  
  if (((this->super_DynamicTypeHandler).flags & 1) == 0) {
    bVar1 = DynamicObject::HasObjectArray(instance);
    if (!bVar1) {
      JavascriptError::ThrowCantExtendIfStrictMode
                (flags,(((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
      return 0;
    }
  }
  BVar2 = DynamicTypeHandler::SetItem(&this->super_DynamicTypeHandler,instance,index,value,flags);
  return BVar2;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetItem(DynamicObject* instance, uint32 index, Var value, PropertyOperationFlags flags)
    {
        if (!(this->GetFlags() & IsExtensibleFlag) && !instance->HasObjectArray())
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            JavascriptError::ThrowCantExtendIfStrictMode(flags, scriptContext);
            return false;
        }
        return __super::SetItem(instance, index, value, flags);
    }